

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

size_t __thiscall Imf_3_3::DeepTiledInputFile::totalTiles(DeepTiledInputFile *this)

{
  LevelMode LVar1;
  int iVar2;
  int iVar3;
  ArgExc *this_00;
  int i_lx;
  int i_ly;
  int i_l;
  int numAllTiles;
  DeepTiledInputFile *in_stack_00000160;
  int in_stack_0000016c;
  DeepTiledInputFile *in_stack_00000170;
  char *in_stack_ffffffffffffffa8;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = 0;
  LVar1 = levelMode((DeepTiledInputFile *)0x19c1a0);
  if (LVar1 < RIPMAP_LEVELS) {
    for (local_10 = 0; iVar2 = numLevels(in_stack_00000160), local_10 < iVar2;
        local_10 = local_10 + 1) {
      iVar2 = numXTiles(in_stack_00000170,in_stack_0000016c);
      iVar3 = numYTiles(in_stack_00000170,in_stack_0000016c);
      local_c = iVar2 * iVar3 + local_c;
    }
  }
  else {
    if (LVar1 != RIPMAP_LEVELS) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffffa8);
      __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    for (local_14 = 0; iVar2 = numYLevels((DeepTiledInputFile *)0x19c23c), local_14 < iVar2;
        local_14 = local_14 + 1) {
      for (local_18 = 0; iVar2 = numXLevels((DeepTiledInputFile *)0x19c260), local_18 < iVar2;
          local_18 = local_18 + 1) {
        iVar2 = numXTiles(in_stack_00000170,in_stack_0000016c);
        iVar3 = numYTiles(in_stack_00000170,in_stack_0000016c);
        local_c = iVar2 * iVar3 + local_c;
      }
    }
  }
  return (long)local_c;
}

Assistant:

size_t
DeepTiledInputFile::totalTiles () const
{
    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:

            for (int i_l = 0; i_l < numLevels (); ++i_l)
                numAllTiles += numXTiles (i_l) * numYTiles (i_l);

            break;

        case RIPMAP_LEVELS:

            for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
                for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                    numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }
    return numAllTiles;
}